

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

phf_hash_t
phf_hash_<true,unsigned_char,std::__cxx11::string>
          (uchar *g,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
          uint32_t seed,size_t r,size_t m)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint local_34;
  size_t sStack_30;
  uint32_t d;
  size_t m_local;
  size_t r_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_18;
  uint32_t seed_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  uchar *g_local;
  
  sStack_30 = m;
  m_local = r;
  r_local._4_4_ = seed;
  pbStack_18 = k;
  k_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)g;
  std::__cxx11::string::string((string *)&local_58,(string *)k);
  uVar3 = phf_g<std::__cxx11::string>(&local_58,r_local._4_4_);
  bVar1 = g[uVar3 & (int)m_local - 1U];
  std::__cxx11::string::~string((string *)&local_58);
  local_34 = (uint)bVar1;
  std::__cxx11::string::string((string *)&local_88,(string *)k);
  uVar3 = phf_f<std::__cxx11::string>((uint)bVar1,&local_88,r_local._4_4_);
  iVar2 = (int)sStack_30;
  std::__cxx11::string::~string((string *)&local_88);
  return uVar3 & iVar2 - 1U;
}

Assistant:

static inline phf_hash_t phf_hash_(map_t *g, key_t k, uint32_t seed, size_t r, size_t m) {
	if (nodiv) {
		uint32_t d = g[phf_g(k, seed) & (r - 1)];

		return phf_f(d, k, seed) & (m - 1);
	} else {
		uint32_t d = g[phf_g(k, seed) % r];

		return phf_f(d, k, seed) % m;
	}
}